

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

int __thiscall
QAccessibleAbstractScrollArea::indexOfChild
          (QAccessibleAbstractScrollArea *this,QAccessibleInterface *child)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long in_FS_OFFSET;
  QWidgetList local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = -1;
  if ((child != (QAccessibleInterface *)0x0) &&
     (lVar2 = (**(code **)(*(long *)child + 0x18))(child), lVar2 != 0)) {
    accessibleChildren(&local_38,this);
    lVar2 = (**(code **)(*(long *)child + 0x18))(child);
    if (lVar2 == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = 0;
      if ((*(byte *)(*(long *)(lVar2 + 8) + 0x30) & 1) != 0) {
        lVar3 = lVar2;
      }
    }
    if (local_38.d.size == 0) {
LAB_005160be:
      iVar4 = -1;
    }
    else {
      iVar4 = -1;
      lVar2 = 0;
      do {
        if (local_38.d.size << 3 == lVar2) goto LAB_005160be;
        iVar4 = iVar4 + 1;
        plVar1 = (long *)((long)local_38.d.ptr + lVar2);
        lVar2 = lVar2 + 8;
      } while (*plVar1 != lVar3);
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QAccessibleAbstractScrollArea::indexOfChild(const QAccessibleInterface *child) const
{
    if (!child || !child->object())
        return -1;
    return accessibleChildren().indexOf(qobject_cast<QWidget *>(child->object()));
}